

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExternalWrenchesEstimation.cpp
# Opt level: O3

Wrench * iDynTree::computeKnownTermsOfEstimationEquationWithoutInternalFT
                   (Wrench *__return_storage_ptr__,Model *model,Traversal *modelTraversal,
                   JointPosDoubleArray *jointPos,LinkVelArray *linkVel,LinkAccArray *linkProperAcc,
                   estimateExternalWrenchesBuffers *bufs)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  Twist *pTVar6;
  SpatialMomentum *pSVar7;
  Wrench *pWVar8;
  long lVar9;
  long lVar10;
  long *plVar11;
  Transform *pTVar12;
  LinkWrenches *this;
  uint uVar13;
  Transform visitedLink_X_child;
  SpatialInertia local_138 [56];
  Twist local_100 [56];
  Wrench local_c8;
  SpatialInertia local_68 [56];
  
  iVar1 = iDynTree::Traversal::getNrOfVisitedLinks();
  this = &bufs->b_contacts_subtree;
  do {
    iVar1 = iVar1 + -1;
    if (iVar1 < 0) {
      local_c8._0_8_ = iDynTree::Wrench::operator+;
      local_c8._8_8_ = 0;
      local_c8._16_8_ = 0;
      local_c8._24_8_ = 0;
      local_c8._32_8_ = 0;
      local_c8._40_8_ = 0;
      local_c8._48_8_ = 0;
      iDynTree::Wrench::Wrench(__return_storage_ptr__,&local_c8.super_SpatialForceVector);
      iDynTree::SpatialForceVector::~SpatialForceVector(&local_c8.super_SpatialForceVector);
      return __return_storage_ptr__;
    }
    iDynTree::Traversal::getLink((long)modelTraversal);
    lVar4 = iDynTree::Link::getIndex();
    lVar5 = iDynTree::Traversal::getParentLink((long)modelTraversal);
    pTVar6 = (Twist *)iDynTree::Link::getInertia();
    iDynTree::LinkAccArray::operator()(linkProperAcc,lVar4);
    pSVar7 = (SpatialMomentum *)iDynTree::LinkVelArray::operator()(linkVel,lVar4);
    iDynTree::SpatialInertia::operator*(local_138,(SpatialAcc *)pTVar6);
    iDynTree::SpatialInertia::operator*(local_68,pTVar6);
    iDynTree::Twist::operator*(local_100,pSVar7);
    iDynTree::Wrench::operator+(&local_c8,(Wrench *)local_138);
    pWVar8 = (Wrench *)iDynTree::LinkWrenches::operator()(this,lVar4);
    iDynTree::Wrench::operator=(pWVar8,(Wrench *)&local_c8.super_SpatialForceVector);
    iDynTree::SpatialForceVector::~SpatialForceVector(&local_c8.super_SpatialForceVector);
    iDynTree::SpatialForceVector::~SpatialForceVector((SpatialForceVector *)local_100);
    iDynTree::SpatialForceVector::~SpatialForceVector((SpatialForceVector *)local_68);
    iDynTree::SpatialForceVector::~SpatialForceVector((SpatialForceVector *)local_138);
    iVar2 = iDynTree::Model::getNrOfNeighbors((long)model);
    if (iVar2 != 0) {
      uVar13 = 0;
      do {
        lVar9 = iDynTree::Model::getNeighbor((long)model,(uint)lVar4);
        if ((lVar5 == 0) || (lVar10 = iDynTree::Link::getIndex(), lVar9 != lVar10)) {
          iDynTree::Model::getNeighbor((long)model,(uint)lVar4);
          plVar11 = (long *)iDynTree::Model::getJoint((long)model);
          pTVar12 = (Transform *)(**(code **)(*plVar11 + 0x50))(plVar11,jointPos,lVar4,lVar9);
          iDynTree::Transform::Transform((Transform *)&local_c8,pTVar12);
          pWVar8 = (Wrench *)iDynTree::LinkWrenches::operator()(this,lVar4);
          iDynTree::LinkWrenches::operator()(this,lVar9);
          iDynTree::Transform::operator*((Transform *)local_100,&local_c8);
          iDynTree::Wrench::operator+((Wrench *)local_138,pWVar8);
          pWVar8 = (Wrench *)iDynTree::LinkWrenches::operator()(this,lVar4);
          iDynTree::Wrench::operator=(pWVar8,(Wrench *)local_138);
          iDynTree::SpatialForceVector::~SpatialForceVector((SpatialForceVector *)local_138);
          iDynTree::SpatialForceVector::~SpatialForceVector((SpatialForceVector *)local_100);
        }
        uVar13 = uVar13 + 1;
        uVar3 = iDynTree::Model::getNrOfNeighbors((long)model);
      } while (uVar13 < uVar3);
    }
  } while (lVar5 != 0);
  pWVar8 = (Wrench *)iDynTree::LinkWrenches::operator()(this,lVar4);
  iDynTree::Wrench::Wrench(__return_storage_ptr__,pWVar8);
  return __return_storage_ptr__;
}

Assistant:

Wrench computeKnownTermsOfEstimationEquationWithoutInternalFT(const Model& model,
                                                              const Traversal& modelTraversal,
                                                              const JointPosDoubleArray & jointPos,
                                                              const LinkVelArray& linkVel,
                                                              const LinkAccArray& linkProperAcc,
                                                                    estimateExternalWrenchesBuffers& bufs)
{
    // First compute the known term of the estimation for each link:
    // this loop is similar to the dynamic phase of the RNEA
    // \todo pimp up performance as done in RNEADynamicPhase
     for(int traversalEl = modelTraversal.getNrOfVisitedLinks()-1; traversalEl >= 0; traversalEl--)
     {
         LinkConstPtr visitedLink = modelTraversal.getLink(traversalEl);
         LinkIndex    visitedLinkIndex = visitedLink->getIndex();
         LinkConstPtr parentLink  = modelTraversal.getParentLink(traversalEl);

         const iDynTree::SpatialInertia & I = visitedLink->getInertia();
         const iDynTree::SpatialAcc     & properAcc = linkProperAcc(visitedLinkIndex);
         const iDynTree::Twist          & v = linkVel(visitedLinkIndex);
         bufs.b_contacts_subtree(visitedLinkIndex) = I*properAcc + v*(I*v);

         // Iterate on childs of visitedLink
         // We obtain all the children as all the neighbors of the link, except
         // for its parent
         // \todo TODO this point is definitly Tree-specific
         // \todo TODO this "get child" for is duplicated in the code, we
         //            should try to consolidate it
         for(unsigned int neigh_i=0; neigh_i < model.getNrOfNeighbors(visitedLinkIndex); neigh_i++)
         {
             LinkIndex neighborIndex = model.getNeighbor(visitedLinkIndex,neigh_i).neighborLink;
             if( !parentLink || neighborIndex != parentLink->getIndex() )
             {
                 LinkIndex childIndex = neighborIndex;
                 IJointConstPtr neighborJoint = model.getJoint(model.getNeighbor(visitedLinkIndex,neigh_i).neighborJoint);
                 Transform visitedLink_X_child = neighborJoint->getTransform(jointPos,visitedLinkIndex,childIndex);

                 // One term of the sum in Equation 5.20 in Featherstone 2008
                 bufs.b_contacts_subtree(visitedLinkIndex) = bufs.b_contacts_subtree(visitedLinkIndex)
                                                            + visitedLink_X_child*bufs.b_contacts_subtree(childIndex);
             }
         }

         if( parentLink == 0 )
         {
             // If the visited link is the base of the submodel, the
             // computed known terms is the known term of the submodel itself
             return bufs.b_contacts_subtree(visitedLinkIndex);
         }
     }

     assert(false);
     return Wrench::Zero();
}